

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

StringTree * __thiscall
kj::strTree<char,unsigned_short,char>
          (StringTree *__return_storage_ptr__,kj *this,char *params,unsigned_short *params_1,
          char *params_2)

{
  char *pcVar1;
  unsigned_short *value;
  char local_41 [1];
  CappedArray<char,_8UL> local_40;
  char local_29 [1];
  unsigned_short *local_28;
  char *params_local_2;
  unsigned_short *params_local_1;
  char *params_local;
  
  local_28 = params_1;
  params_local_2 = params;
  params_local_1 = (unsigned_short *)this;
  params_local = (char *)__return_storage_ptr__;
  pcVar1 = fwd<char>((NoInfer<char> *)this);
  local_29[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar1);
  value = fwd<unsigned_short>((NoInfer<unsigned_short> *)params_local_2);
  local_40 = _::toStringTreeOrCharSequence<unsigned_short>(value);
  pcVar1 = fwd<char>((NoInfer<char> *)local_28);
  local_41[0] = (char)_::toStringTreeOrCharSequence<char>(pcVar1);
  StringTree::concat<kj::FixedArray<char,1ul>,kj::CappedArray<char,8ul>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(StringTree *)local_29,(FixedArray<char,_1UL> *)&local_40,
             (CappedArray<char,_8UL> *)local_41,(FixedArray<char,_1UL> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}